

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O2

void duckdb::FSSTStorage::StringScanPartial<false>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  BufferHandle *this;
  idx_t iVar1;
  FSSTScanState *scan_state;
  data_ptr_t pdVar2;
  StringDictionaryContainer dict;
  VectorStringBuffer *str_buffer;
  data_ptr_t pdVar3;
  idx_t start;
  idx_t index;
  string_t sVar4;
  bp_delta_offsets_t offsets;
  bp_delta_offsets_t local_68;
  
  scan_state = (FSSTScanState *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  start = state->row_index - (segment->super_SegmentBase<duckdb::ColumnSegment>).start;
  this = &(scan_state->super_StringScanState).handle;
  pdVar2 = BufferHandle::Ptr(this);
  iVar1 = segment->offset;
  dict = GetDictionary(segment,this);
  if (scan_count != 0) {
    pdVar3 = result->data;
    StartScan(&local_68,scan_state,pdVar2 + iVar1 + 0x10,start,scan_count);
    str_buffer = StringVector::GetStringBuffer(result);
    pdVar3 = pdVar3 + result_offset * 0x10 + 8;
    for (index = 0; scan_count != index; index = index + 1) {
      sVar4 = FSSTScanState::DecompressString
                        (scan_state,dict,pdVar2 + iVar1,&local_68,index,str_buffer);
      *(long *)(pdVar3 + -8) = sVar4.value._0_8_;
      *(long *)pdVar3 = sVar4.value._8_8_;
      pdVar3 = pdVar3 + 0x10;
    }
    scan_state->last_known_index =
         (scan_state->delta_decode_buffer).
         super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
         [local_68.unused_delta_decoded_values + scan_count + 0xffffffffffffffff];
    scan_state->last_known_row = scan_count + start + -1;
  }
  return;
}

Assistant:

void FSSTStorage::StringScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                                    idx_t result_offset) {

	auto &scan_state = state.scan_state->Cast<FSSTScanState>();
	auto start = segment.GetRelativeIndex(state.row_index);

	bool enable_fsst_vectors;
	if (ALLOW_FSST_VECTORS) {
		auto &config = DBConfig::GetConfig(segment.db);
		enable_fsst_vectors = config.options.enable_fsst_vectors;
	} else {
		enable_fsst_vectors = false;
	}

	auto baseptr = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto dict = GetDictionary(segment, scan_state.handle);
	auto base_data = data_ptr_cast(baseptr + sizeof(fsst_compression_header_t));
	string_t *result_data;

	if (scan_count == 0) {
		return;
	}

	if (enable_fsst_vectors) {
		D_ASSERT(result_offset == 0);
		if (scan_state.duckdb_fsst_decoder) {
			D_ASSERT(result_offset == 0 || result.GetVectorType() == VectorType::FSST_VECTOR);
			result.SetVectorType(VectorType::FSST_VECTOR);
			auto string_block_limit = StringUncompressed::GetStringBlockLimit(segment.GetBlockManager().GetBlockSize());
			FSSTVector::RegisterDecoder(result, scan_state.duckdb_fsst_decoder, string_block_limit);
			result_data = FSSTVector::GetCompressedData<string_t>(result);
		} else {
			D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
			result_data = FlatVector::GetData<string_t>(result);
		}
	} else {
		D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
		result_data = FlatVector::GetData<string_t>(result);
	}

	auto offsets = StartScan(scan_state, base_data, start, scan_count);
	auto &bitunpack_buffer = scan_state.bitunpack_buffer;
	auto &delta_decode_buffer = scan_state.delta_decode_buffer;
	if (enable_fsst_vectors) {
		// Lookup decompressed offsets in dict
		for (idx_t i = 0; i < scan_count; i++) {
			uint32_t string_length = bitunpack_buffer[i + offsets.scan_offset];
			result_data[i] = UncompressedStringStorage::FetchStringFromDict(
			    segment, dict.end, result, baseptr,
			    UnsafeNumericCast<int32_t>(delta_decode_buffer[i + offsets.unused_delta_decoded_values]),
			    string_length);
			FSSTVector::SetCount(result, scan_count);
		}
	} else {
		// Just decompress
		auto &str_buffer = StringVector::GetStringBuffer(result);
		for (idx_t i = 0; i < scan_count; i++) {
			result_data[i + result_offset] = scan_state.DecompressString(dict, baseptr, offsets, i, str_buffer);
		}
	}
	EndScan(scan_state, offsets, start, scan_count);
}